

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

bool vk::isCompatible(VkLayerProperties *layerProperties,RequiredLayer *required)

{
  bool bVar1;
  uint *puVar2;
  RequiredLayer *required_local;
  VkLayerProperties *layerProperties_local;
  
  bVar1 = std::operator!=(&required->name,layerProperties->layerName);
  if (bVar1) {
    layerProperties_local._7_1_ = false;
  }
  else {
    bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&required->minSpecVersion);
    if ((bVar1) &&
       (puVar2 = tcu::Maybe<unsigned_int>::get(&required->minSpecVersion),
       layerProperties->specVersion < *puVar2)) {
      layerProperties_local._7_1_ = false;
    }
    else {
      bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&required->maxSpecVersion);
      if ((bVar1) &&
         (puVar2 = tcu::Maybe<unsigned_int>::get(&required->maxSpecVersion),
         *puVar2 < layerProperties->specVersion)) {
        layerProperties_local._7_1_ = false;
      }
      else {
        bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&required->minImplVersion);
        if ((bVar1) &&
           (puVar2 = tcu::Maybe<unsigned_int>::get(&required->minImplVersion),
           layerProperties->implementationVersion < *puVar2)) {
          layerProperties_local._7_1_ = false;
        }
        else {
          bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&required->maxImplVersion);
          if ((bVar1) &&
             (puVar2 = tcu::Maybe<unsigned_int>::get(&required->maxImplVersion),
             *puVar2 < layerProperties->implementationVersion)) {
            layerProperties_local._7_1_ = false;
          }
          else {
            layerProperties_local._7_1_ = true;
          }
        }
      }
    }
  }
  return layerProperties_local._7_1_;
}

Assistant:

bool isCompatible (const VkLayerProperties& layerProperties, const RequiredLayer& required)
{
	if (required.name != layerProperties.layerName)
		return false;

	if (required.minSpecVersion && required.minSpecVersion.get() > layerProperties.specVersion)
		return false;

	if (required.maxSpecVersion && required.maxSpecVersion.get() < layerProperties.specVersion)
		return false;

	if (required.minImplVersion && required.minImplVersion.get() > layerProperties.implementationVersion)
		return false;

	if (required.maxImplVersion && required.maxImplVersion.get() < layerProperties.implementationVersion)
		return false;

	return true;
}